

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_GetImageOffsetTest_ImageOffsetWithRowPadding_Test::TestBody
          (ktxTexture_GetImageOffsetTest_ImageOffsetWithRowPadding_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  Message *pMVar3;
  AssertHelper *this_00;
  byte bVar4;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int levelRowBytes;
  ktx_uint32_t levelHeight;
  ktx_uint32_t levelWidth;
  ktx_uint32_t i;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t rowRounding;
  ktx_uint32_t rowBytes;
  ktx_size_t offset;
  ktx_size_t imageSize;
  ktx_size_t expectedOffset;
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe18) [28];
  AssertionResult *in_stack_fffffffffffffe20;
  ktx_error_code_e *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  int line;
  char *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe9c;
  AssertHelper *in_stack_fffffffffffffea0;
  uint local_144;
  AssertionResult local_130 [2];
  undefined4 local_110;
  undefined4 local_10c;
  AssertionResult local_108;
  uint local_f4;
  string local_f0 [40];
  AssertHelper *local_c8;
  undefined1 local_b1;
  AssertionResult local_b0 [3];
  undefined4 local_7c;
  AssertionResult local_78;
  int local_68;
  undefined4 local_64;
  undefined1 local_60 [8];
  ulong local_58;
  ulong local_50;
  undefined4 local_44;
  undefined4 local_40 [4];
  undefined4 local_30;
  int local_20;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_10[0] = 0;
  TestCreateInfo::TestCreateInfo((TestCreateInfo *)0x1452d8);
  local_40[0] = 0x8051;
  local_30 = 9;
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_7c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffe38,
             (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28,(ktx_error_code_e *)in_stack_fffffffffffffe20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::AssertionResult::failure_message((AssertionResult *)0x145376);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffea0,
               (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x1453d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145441);
  local_b1 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe20,(bool *)in_stack_fffffffffffffe18,(type *)0x14546f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::Message::operator<<((Message *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe50 = (AssertHelper *)ktxErrorString(local_44);
    local_c8 = in_stack_fffffffffffffe50;
    pMVar3 = testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe20,(char **)in_stack_fffffffffffffe18);
    type = (Type)((ulong)pMVar3 >> 0x20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (char *)in_stack_fffffffffffffe80._M_head_impl);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffea0,
               (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_f0);
    testing::Message::~Message((Message *)0x145593);
  }
  local_f4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145640);
  if (local_f4 == 0) {
    local_64 = 0x1b;
    local_68 = 1;
    local_58 = (ulong)(uint)(*(int *)(local_10[0] + 0x28) * 0x1c);
    local_50 = local_58;
    local_10c = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,0,0,local_60);
    local_110 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,(ktx_error_code_e *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe40 =
           testing::AssertionResult::failure_message((AssertionResult *)0x14575d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,
                 (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x1457ba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x145828);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (unsigned_long *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x145899);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,
                 (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x1458f6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x145967);
    local_50 = 0;
    for (local_144 = 0; local_144 < *(int *)(local_10[0] + 0x34) - 1U; local_144 = local_144 + 1) {
      bVar4 = (byte)local_144;
      if (*(uint *)(local_10[0] + 0x24) >> (bVar4 & 0x1f) == 0) {
        in_stack_fffffffffffffe34 = 1;
      }
      else {
        in_stack_fffffffffffffe34 = *(uint *)(local_10[0] + 0x24) >> (bVar4 & 0x1f);
      }
      if (*(uint *)(local_10[0] + 0x28) >> (bVar4 & 0x1f) == 0) {
        in_stack_fffffffffffffe30 = 1;
      }
      else {
        in_stack_fffffffffffffe30 = *(uint *)(local_10[0] + 0x28) >> (bVar4 & 0x1f);
      }
      local_68 = 3 - (int)(in_stack_fffffffffffffe34 * 3 + 3) % 4;
      local_58 = (ulong)((local_68 + in_stack_fffffffffffffe34 * 3) * in_stack_fffffffffffffe30);
      local_50 = local_58 + local_50;
    }
    uVar2 = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],local_20 + -1,0,0,local_60);
    uVar5 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,(ktx_error_code_e *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffea0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe28 =
           (ktx_error_code_e *)
           testing::AssertionResult::failure_message((AssertionResult *)0x145b73);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,(Message *)CONCAT44(uVar2,uVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x145bc1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x145c29);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (unsigned_long *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20
              );
    line = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x145c8e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,line,
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,(Message *)CONCAT44(uVar2,uVar5));
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x145cdc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x145d3e);
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_GetImageOffsetTest, ImageOffsetWithRowPadding) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    ktx_size_t expectedOffset, imageSize, offset;
    ktx_uint32_t rowBytes, rowRounding;

    // Pick type and size that requires row padding for KTX_GL_UNPACK_ALIGNMENT.
    createInfo.glInternalformat = GL_RGB8;
    createInfo.baseWidth = 9;
    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    rowBytes = 9 * 3;
    rowRounding = ROUNDING(rowBytes);
    imageSize = (rowBytes + rowRounding) * texture->baseHeight;
    expectedOffset = imageSize;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);

    expectedOffset = 0;
    for (ktx_uint32_t i = 0; i < texture->numLevels - 1; i++) {
        ktx_uint32_t levelWidth = MAX(1, texture->baseWidth >> i);
        ktx_uint32_t levelHeight = MAX(1, texture->baseHeight >> i);

        int levelRowBytes = levelWidth * 3;
        rowRounding = ROUNDING(levelRowBytes);
        levelRowBytes += rowRounding;
        imageSize = levelRowBytes * levelHeight;
        expectedOffset += imageSize;
    }
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, createInfo.numLevels - 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    if (texture)
        ktxTexture_Destroy(texture);
}